

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O0

int jsgf_write_fsg(jsgf_t *grammar,jsgf_rule_t *rule,FILE *outfh)

{
  logmath_t *lmath_00;
  fsg_model_t *fsg_00;
  logmath_t *lmath;
  fsg_model_t *fsg;
  FILE *outfh_local;
  jsgf_rule_t *rule_local;
  jsgf_t *grammar_local;
  
  lmath_00 = logmath_init(1.0001,0,0);
  fsg_00 = jsgf_build_fsg_raw(grammar,rule,lmath_00,1.0);
  if (fsg_00 == (fsg_model_t *)0x0) {
    logmath_free(lmath_00);
    grammar_local._4_4_ = -1;
  }
  else {
    fsg_model_write(fsg_00,outfh);
    logmath_free(lmath_00);
    grammar_local._4_4_ = 0;
  }
  return grammar_local._4_4_;
}

Assistant:

int
jsgf_write_fsg(jsgf_t * grammar, jsgf_rule_t * rule, FILE * outfh)
{
    fsg_model_t *fsg;
    logmath_t *lmath = logmath_init(1.0001, 0, 0);

    if ((fsg = jsgf_build_fsg_raw(grammar, rule, lmath, 1.0)) == NULL)
        goto error_out;

    fsg_model_write(fsg, outfh);
    logmath_free(lmath);
    return 0;

  error_out:
    logmath_free(lmath);
    return -1;
}